

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_IsInstanceOf(JSContext *ctx,JSValue val,JSValue obj)

{
  ushort uVar1;
  int iVar2;
  char cVar3;
  JSValue JVar4;
  JSValueUnion local_38;
  int64_t local_30;
  
  local_30 = val.tag;
  local_38 = val.u;
  if ((int)obj.tag != -1) {
LAB_0011cbd2:
    JS_ThrowTypeError(ctx,"invalid \'instanceof\' right operand");
    return -1;
  }
  JVar4 = JS_GetPropertyInternal(ctx,obj,0xce,obj,0);
  if (1 < (int)JVar4.tag - 2U) {
    if ((int)JVar4.tag == 6) {
      return -1;
    }
    JVar4 = JS_CallFree(ctx,JVar4,obj,1,(JSValue *)&local_38);
    iVar2 = JS_ToBoolFree(ctx,JVar4);
    return iVar2;
  }
  uVar1 = *(ushort *)((long)obj.u.ptr + 6);
  if (uVar1 != 0xd) {
    if (uVar1 == 0x29) {
      cVar3 = *(char *)(*(long *)((long)obj.u.ptr + 0x30) + 0x20);
    }
    else {
      cVar3 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
    }
    if (cVar3 == '\0') goto LAB_0011cbd2;
  }
  iVar2 = JS_OrdinaryIsInstanceOf(ctx,val,obj);
  return iVar2;
}

Assistant:

int JS_IsInstanceOf(JSContext *ctx, JSValueConst val, JSValueConst obj)
{
    JSValue method;

    if (!JS_IsObject(obj))
        goto fail;
    method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_hasInstance);
    if (JS_IsException(method))
        return -1;
    if (!JS_IsNull(method) && !JS_IsUndefined(method)) {
        JSValue ret;
        ret = JS_CallFree(ctx, method, obj, 1, &val);
        return JS_ToBoolFree(ctx, ret);
    }

    /* legacy case */
    if (!JS_IsFunction(ctx, obj)) {
    fail:
        JS_ThrowTypeError(ctx, "invalid 'instanceof' right operand");
        return -1;
    }
    return JS_OrdinaryIsInstanceOf(ctx, val, obj);
}